

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DisableForkStatement * __thiscall
slang::BumpAllocator::emplace<slang::ast::DisableForkStatement,slang::SourceRange>
          (BumpAllocator *this,SourceRange *args)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  DisableForkStatement *pDVar3;
  
  pDVar3 = (DisableForkStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DisableForkStatement *)this->endPtr < pDVar3 + 1) {
    pDVar3 = (DisableForkStatement *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pDVar3 + 1);
  }
  SVar1 = args->startLoc;
  SVar2 = args->endLoc;
  (pDVar3->super_Statement).kind = DisableFork;
  (pDVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pDVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pDVar3->super_Statement).sourceRange.endLoc = SVar2;
  return pDVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }